

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cPalEntry,cBGRA,bSubtract>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  EBlend EVar5;
  FSpecialColormap *pFVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  BYTE BVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  BYTE *pBVar17;
  
  pFVar6 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_004d432e_caseD_0:
    lVar14 = 0;
    if (count < 1) {
      count = 0;
    }
    pBVar17 = pin + 3;
    for (; count != (int)lVar14; lVar14 = lVar14 + 1) {
      BVar11 = *pBVar17;
      if (BVar11 != '\0') {
        iVar12 = (uint)pout[lVar14 * 4 + 2] * 0x10000 - (uint)pBVar17[-1] * inf->alpha;
        if (iVar12 >> 0x10 < 1) {
          iVar12 = 0;
        }
        pout[lVar14 * 4 + 2] = (BYTE)((uint)iVar12 >> 0x10);
        iVar12 = (uint)pout[lVar14 * 4 + 1] * 0x10000 - (uint)pBVar17[-2] * inf->alpha;
        if (iVar12 >> 0x10 < 1) {
          iVar12 = 0;
        }
        pout[lVar14 * 4 + 1] = (BYTE)((uint)iVar12 >> 0x10);
        iVar12 = (uint)pout[lVar14 * 4] * 0x10000 - (uint)pBVar17[-3] * inf->alpha;
        if (iVar12 >> 0x10 < 1) {
          iVar12 = 0;
        }
        pout[lVar14 * 4] = (BYTE)((uint)iVar12 >> 0x10);
        pout[lVar14 * 4 + 3] = BVar11;
      }
      pBVar17 = pBVar17 + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_004d432e_caseD_0;
    case BLEND_ICEMAP:
      uVar15 = 0;
      uVar16 = (ulong)(uint)count;
      if (count < 1) {
        uVar16 = uVar15;
      }
      for (; (int)uVar16 != (int)uVar15; uVar15 = uVar15 + 1) {
        BVar11 = pin[3];
        if (BVar11 != '\0') {
          iVar8 = cPalEntry::Gray(pin);
          iVar8 = iVar8 >> 4;
          iVar12 = (uint)pout[uVar15 * 4 + 2] * 0x10000 - (uint)IcePalette[iVar8][0] * inf->alpha;
          if (iVar12 >> 0x10 < 1) {
            iVar12 = 0;
          }
          pout[uVar15 * 4 + 2] = (BYTE)((uint)iVar12 >> 0x10);
          iVar12 = (uint)pout[uVar15 * 4 + 1] * 0x10000 - (uint)IcePalette[iVar8][1] * inf->alpha;
          if (iVar12 >> 0x10 < 1) {
            iVar12 = 0;
          }
          pout[uVar15 * 4 + 1] = (BYTE)((uint)iVar12 >> 0x10);
          iVar12 = (uint)pout[uVar15 * 4] * 0x10000 - (uint)IcePalette[iVar8][2] * inf->alpha;
          if (iVar12 >> 0x10 < 1) {
            iVar12 = 0;
          }
          pout[uVar15 * 4] = (BYTE)((uint)iVar12 >> 0x10);
          pout[uVar15 * 4 + 3] = BVar11;
        }
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      lVar14 = 0;
      if (count < 1) {
        count = 0;
      }
      pBVar17 = pin + 3;
      for (; count != (int)lVar14; lVar14 = lVar14 + 1) {
        BVar11 = *pBVar17;
        if (BVar11 != '\0') {
          iVar12 = inf->blendcolor[3];
          iVar8 = (uint)pout[lVar14 * 4 + 2] * 0x10000 -
                  ((uint)pBVar17[-1] * iVar12 + inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha;
          if (iVar8 >> 0x10 < 1) {
            iVar8 = 0;
          }
          bVar1 = pBVar17[-2];
          iVar13 = inf->blendcolor[1];
          bVar2 = pBVar17[-3];
          iVar4 = inf->blendcolor[2];
          pout[lVar14 * 4 + 2] = (BYTE)((uint)iVar8 >> 0x10);
          iVar8 = (uint)pout[lVar14 * 4 + 1] * 0x10000 -
                  ((uint)bVar1 * iVar12 + iVar13 >> 0x10 & 0xff) * inf->alpha;
          if (iVar8 >> 0x10 < 1) {
            iVar8 = 0;
          }
          pout[lVar14 * 4 + 1] = (BYTE)((uint)iVar8 >> 0x10);
          iVar12 = (uint)pout[lVar14 * 4] * 0x10000 -
                   ((uint)bVar2 * iVar12 + iVar4 >> 0x10 & 0xff) * inf->alpha;
          if (iVar12 >> 0x10 < 1) {
            iVar12 = 0;
          }
          pout[lVar14 * 4] = (BYTE)((uint)iVar12 >> 0x10);
          pout[lVar14 * 4 + 3] = BVar11;
        }
        pBVar17 = pBVar17 + step;
      }
      break;
    case BLEND_MODULATE:
      lVar14 = 0;
      if (count < 1) {
        count = 0;
      }
      pBVar17 = pin + 3;
      for (; count != (int)lVar14; lVar14 = lVar14 + 1) {
        BVar11 = *pBVar17;
        if (BVar11 != '\0') {
          iVar12 = (uint)pout[lVar14 * 4 + 2] * 0x10000 -
                   ((uint)pBVar17[-1] * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha;
          if (iVar12 >> 0x10 < 1) {
            iVar12 = 0;
          }
          bVar1 = pBVar17[-2];
          iVar8 = inf->blendcolor[1];
          bVar2 = pBVar17[-3];
          iVar13 = inf->blendcolor[2];
          pout[lVar14 * 4 + 2] = (BYTE)((uint)iVar12 >> 0x10);
          iVar12 = (uint)pout[lVar14 * 4 + 1] * 0x10000 -
                   ((uint)bVar1 * iVar8 >> 0x10 & 0xff) * inf->alpha;
          if (iVar12 >> 0x10 < 1) {
            iVar12 = 0;
          }
          pout[lVar14 * 4 + 1] = (BYTE)((uint)iVar12 >> 0x10);
          iVar12 = (uint)pout[lVar14 * 4] * 0x10000 -
                   ((uint)bVar2 * iVar13 >> 0x10 & 0xff) * inf->alpha;
          if (iVar12 >> 0x10 < 1) {
            iVar12 = 0;
          }
          pout[lVar14 * 4] = (BYTE)((uint)iVar12 >> 0x10);
          pout[lVar14 * 4 + 3] = BVar11;
        }
        pBVar17 = pBVar17 + step;
      }
      break;
    default:
      EVar5 = inf->blend;
      lVar14 = (long)EVar5;
      if (lVar14 < 0x21) {
        if (BLEND_ICEMAP < EVar5) {
          iVar12 = 0x20 - EVar5;
          if (count < 1) {
            count = 0;
          }
          for (lVar14 = 0; count != (int)lVar14; lVar14 = lVar14 + 1) {
            bVar1 = pin[3];
            if (bVar1 != 0) {
              iVar8 = cPalEntry::Gray(pin);
              iVar8 = iVar8 * (EVar5 + BLEND_MODULATE);
              bVar2 = pin[1];
              bVar3 = *pin;
              iVar13 = (uint)pout[lVar14 * 4 + 2] * 0x10000 -
                       ((int)((uint)pin[2] * iVar12 + iVar8) / 0x1f & 0xffU) * inf->alpha;
              BVar11 = (BYTE)((uint)iVar13 >> 0x10);
              if (iVar13 >> 0x10 < 1) {
                BVar11 = '\0';
              }
              pout[lVar14 * 4 + 2] = BVar11;
              iVar13 = (uint)pout[lVar14 * 4 + 1] * 0x10000 -
                       ((int)((uint)bVar2 * iVar12 + iVar8) / 0x1f & 0xffU) * inf->alpha;
              BVar11 = (BYTE)((uint)iVar13 >> 0x10);
              if (iVar13 >> 0x10 < 1) {
                BVar11 = '\0';
              }
              pout[lVar14 * 4 + 1] = BVar11;
              iVar8 = (uint)pout[lVar14 * 4] * 0x10000 -
                      ((int)((uint)bVar3 * iVar12 + iVar8) / 0x1f & 0xffU) * inf->alpha;
              BVar11 = (BYTE)((uint)iVar8 >> 0x10);
              if (iVar8 >> 0x10 < 1) {
                BVar11 = '\0';
              }
              pout[lVar14 * 4] = BVar11;
              pout[lVar14 * 4 + 3] = bVar1;
            }
            pin = pin + step;
          }
        }
      }
      else {
        uVar15 = 0;
        uVar16 = (ulong)(uint)count;
        if (count < 1) {
          uVar16 = uVar15;
        }
        for (; (int)uVar16 != (int)uVar15; uVar15 = uVar15 + 1) {
          BVar11 = pin[3];
          if (BVar11 != '\0') {
            uVar7 = cPalEntry::Gray(pin);
            uVar9 = 0xff;
            if (uVar7 < 0xff) {
              uVar9 = uVar7;
            }
            uVar10 = (ulong)uVar9;
            if ((int)uVar7 < 1) {
              uVar10 = 0;
            }
            iVar12 = (uint)pout[uVar15 * 4 + 2] * 0x10000 -
                     (uint)*(byte *)((long)pFVar6 + uVar10 * 4 + lVar14 * 0x518 + -0xa6fe) *
                     inf->alpha;
            if (iVar12 >> 0x10 < 1) {
              iVar12 = 0;
            }
            bVar1 = *(byte *)((long)pFVar6 + uVar10 * 4 + lVar14 * 0x518 + -0xa700);
            bVar2 = *(byte *)((long)pFVar6 + uVar10 * 4 + lVar14 * 0x518 + -0xa6ff);
            pout[uVar15 * 4 + 2] = (BYTE)((uint)iVar12 >> 0x10);
            iVar12 = (uint)pout[uVar15 * 4 + 1] * 0x10000 - (uint)bVar2 * inf->alpha;
            if (iVar12 >> 0x10 < 1) {
              iVar12 = 0;
            }
            pout[uVar15 * 4 + 1] = (BYTE)((uint)iVar12 >> 0x10);
            iVar12 = (uint)pout[uVar15 * 4] * 0x10000 - (uint)bVar1 * inf->alpha;
            if (iVar12 >> 0x10 < 1) {
              iVar12 = 0;
            }
            pout[uVar15 * 4] = (BYTE)((uint)iVar12 >> 0x10);
            pout[uVar15 * 4 + 3] = BVar11;
          }
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}